

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O0

void * metacallt(char *name,metacall_value_id *ids,...)

{
  type_id tVar1;
  type t_00;
  value pvVar2;
  long lVar3;
  void *pvVar4;
  long in_RSI;
  undefined8 in_RDI;
  char *str;
  type_id id;
  type t;
  va_list va;
  size_t args_count;
  size_t iterator;
  signature s;
  value ret;
  void *args [16];
  function f;
  value f_val;
  char *in_stack_fffffffffffffd48;
  void **in_stack_fffffffffffffd50;
  function_conflict in_stack_fffffffffffffd58;
  value in_stack_fffffffffffffd60;
  function_conflict local_288;
  uint *in_stack_fffffffffffffdc0;
  undefined1 local_1b8 [8];
  int local_f4;
  uint local_e8;
  uint local_e4;
  function_conflict local_e0;
  undefined1 *local_d8;
  ulong local_c8;
  ulong local_c0;
  signature local_b8;
  function_return local_b0;
  undefined8 local_a8 [16];
  function_conflict local_28;
  loader_data local_20;
  long local_18;
  undefined8 local_10;
  function_return local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_20 = loader_get((char *)in_stack_fffffffffffffd50);
  local_28 = (function_conflict)0x0;
  tVar1 = value_type_id(in_stack_fffffffffffffd60);
  if (tVar1 == 0xd) {
    local_28 = value_to_function(in_stack_fffffffffffffd50);
  }
  if (local_28 == (function_conflict)0x0) {
    local_8 = (function_return)0x0;
  }
  else {
    local_b0 = (function_return)0x0;
    local_b8 = function_signature(local_28);
    local_c8 = signature_count(local_b8);
    local_d8 = local_1b8;
    local_e0 = (function_conflict)&stack0x00000008;
    local_e4 = 0x30;
    local_e8 = 0x10;
    for (local_c0 = 0; local_c0 < local_c8; local_c0 = local_c0 + 1) {
      t_00 = signature_get_type((signature)in_stack_fffffffffffffd58,
                                (size_t)in_stack_fffffffffffffd50);
      type_index(t_00);
      if (t_00 == (type)0x0) {
        local_f4 = *(int *)(local_18 + local_c0 * 4);
      }
      else {
        local_f4 = type_index(t_00);
      }
      if (local_f4 == 0) {
        if (local_e8 < 0x29) {
          local_e8 = local_e8 + 8;
        }
        else {
          local_e0 = (function_conflict)&local_e0->s;
        }
        pvVar2 = value_create_bool('\0');
        local_a8[local_c0] = pvVar2;
      }
      if (local_f4 == 1) {
        if (local_e8 < 0x29) {
          local_e8 = local_e8 + 8;
        }
        else {
          local_e0 = (function_conflict)&local_e0->s;
        }
        pvVar2 = value_create_char('\0');
        local_a8[local_c0] = pvVar2;
      }
      else if (local_f4 == 2) {
        if (local_e8 < 0x29) {
          local_e8 = local_e8 + 8;
        }
        else {
          local_e0 = (function_conflict)&local_e0->s;
        }
        pvVar2 = value_create_short(0);
        local_a8[local_c0] = pvVar2;
      }
      else if (local_f4 == 3) {
        if (local_e8 < 0x29) {
          local_e8 = local_e8 + 8;
        }
        else {
          local_e0 = (function_conflict)&local_e0->s;
        }
        pvVar2 = value_create_int(0);
        local_a8[local_c0] = pvVar2;
      }
      else if (local_f4 == 4) {
        if (local_e8 < 0x29) {
          local_e8 = local_e8 + 8;
        }
        else {
          local_e0 = (function_conflict)&local_e0->s;
        }
        pvVar2 = value_create_long(0x1357ec);
        local_a8[local_c0] = pvVar2;
      }
      else if (local_f4 == 5) {
        in_stack_fffffffffffffdc0 = &local_e4;
        if (local_e4 < 0xa1) {
          local_e4 = local_e4 + 0x10;
        }
        else {
          local_e0 = (function_conflict)&local_e0->s;
        }
        pvVar2 = value_create_float(0.0);
        local_a8[local_c0] = pvVar2;
      }
      else if (local_f4 == 6) {
        if (local_e4 < 0xa1) {
          local_e4 = local_e4 + 0x10;
        }
        else {
          local_e0 = (function_conflict)&local_e0->s;
        }
        pvVar2 = value_create_double(6.26476227057992e-318);
        local_a8[local_c0] = pvVar2;
      }
      else if (local_f4 == 7) {
        if (local_e8 < 0x29) {
          local_288 = (function_conflict)(local_d8 + (int)local_e8);
          local_e8 = local_e8 + 8;
        }
        else {
          local_288 = local_e0;
          local_e0 = (function_conflict)&local_e0->s;
        }
        strlen(local_288->name);
        pvVar2 = value_create_string((char *)in_stack_fffffffffffffd50,
                                     (size_t)in_stack_fffffffffffffd48);
        local_a8[local_c0] = pvVar2;
      }
      else if (local_f4 == 0xb) {
        if (local_e8 < 0x29) {
          lVar3 = (long)(int)local_e8;
          local_e8 = local_e8 + 8;
          in_stack_fffffffffffffd58 = (function_conflict)(local_d8 + lVar3);
        }
        else {
          in_stack_fffffffffffffd58 = local_e0;
          local_e0 = (function_conflict)&local_e0->s;
        }
        pvVar2 = value_create_ptr((void *)0x135a52);
        local_a8[local_c0] = pvVar2;
      }
      else {
        in_stack_fffffffffffffd48 = type_id_name(local_f4);
        log_write_impl_va("metacall",0x2e6,"metacallt",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall.c"
                          ,LOG_LEVEL_ERROR,
                          "Calling metacallt with unsupported type \'%s\', using null type instead")
        ;
        pvVar4 = metacall_value_create_null();
        local_a8[local_c0] = pvVar4;
      }
    }
    local_b0 = function_call(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                             (size_t)in_stack_fffffffffffffd48);
    for (local_c0 = 0; local_c0 < local_c8; local_c0 = local_c0 + 1) {
      value_type_destroy(in_stack_fffffffffffffdc0);
    }
    local_8 = local_b0;
  }
  return local_8;
}

Assistant:

void *metacallt(const char *name, const enum metacall_value_id ids[], ...)
{
	value f_val = loader_get(name);
	function f = NULL;

	if (value_type_id(f_val) == TYPE_FUNCTION)
	{
		f = value_to_function(f_val);
	}

	if (f != NULL)
	{
		void *args[METACALL_ARGS_SIZE];

		value ret = NULL;

		signature s = function_signature(f);

		size_t iterator, args_count = signature_count(s);

		va_list va;

		va_start(va, ids);

		for (iterator = 0; iterator < args_count; ++iterator)
		{
			type t = signature_get_type(s, iterator);

			type_id id = type_index(t);

			if (t != NULL)
			{
				id = type_index(t);
			}
			else
			{
				id = ids[iterator];
			}

			if (id == TYPE_BOOL)
			{
				args[iterator] = value_create_bool((boolean)va_arg(va, unsigned int));
			}
			if (id == TYPE_CHAR)
			{
				args[iterator] = value_create_char((char)va_arg(va, int));
			}
			else if (id == TYPE_SHORT)
			{
				args[iterator] = value_create_short((short)va_arg(va, int));
			}
			else if (id == TYPE_INT)
			{
				args[iterator] = value_create_int(va_arg(va, int));
			}
			else if (id == TYPE_LONG)
			{
				args[iterator] = value_create_long(va_arg(va, long));
			}
			else if (id == TYPE_FLOAT)
			{
				args[iterator] = value_create_float((float)va_arg(va, double));
			}
			else if (id == TYPE_DOUBLE)
			{
				args[iterator] = value_create_double(va_arg(va, double));
			}
			else if (id == TYPE_STRING)
			{
				const char *str = va_arg(va, const char *);

				args[iterator] = value_create_string(str, strlen(str));
			}
			else if (id == TYPE_PTR)
			{
				args[iterator] = value_create_ptr(va_arg(va, const void *));
			}
			else
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Calling metacallt with unsupported type '%s', using null type instead", type_id_name(id));
				args[iterator] = metacall_value_create_null();
			}
		}

		va_end(va);

		ret = function_call(f, args, args_count);

		for (iterator = 0; iterator < args_count; ++iterator)
		{
			value_type_destroy(args[iterator]);
		}

		return ret;
	}

	return NULL;
}